

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cordz_handle.cc
# Opt level: O2

bool __thiscall
absl::lts_20250127::cord_internal::CordzHandle::DiagnosticsHandleIsSafeToInspect
          (CordzHandle *this,CordzHandle *handle)

{
  bool bVar1;
  bool bVar2;
  CordzHandle *pCVar3;
  MutexLock lock;
  
  if (this->is_snapshot_ == true) {
    if (handle == (CordzHandle *)0x0) {
      return true;
    }
    if (handle->is_snapshot_ == false) {
      anon_unknown_0::GlobalQueue();
      lock.mu_ = (Mutex *)&anon_unknown_0::GlobalQueue::global_queue;
      Mutex::Lock((Mutex *)&anon_unknown_0::GlobalQueue::global_queue);
      bVar1 = false;
      pCVar3 = (CordzHandle *)anon_unknown_0::GlobalQueue::global_queue.impl_.space_._8_8_;
      do {
        if (pCVar3 == (CordzHandle *)0x0) {
          bVar2 = true;
          if (!bVar1) {
            __assert_fail("false && \"snapshot_found\"",
                          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/strings/internal/cordz_handle.cc"
                          ,0x8e,
                          "auto absl::cord_internal::CordzHandle::DiagnosticsHandleIsSafeToInspect(const CordzHandle *)::(anonymous class)::operator()() const"
                         );
          }
LAB_00306f5e:
          MutexLock::~MutexLock(&lock);
          return bVar2;
        }
        if (pCVar3 == handle) {
          bVar2 = (bool)(bVar1 ^ 1);
          goto LAB_00306f5e;
        }
        if (pCVar3 == this) {
          bVar1 = true;
        }
        pCVar3 = pCVar3->dq_prev_;
      } while( true );
    }
  }
  return false;
}

Assistant:

bool CordzHandle::DiagnosticsHandleIsSafeToInspect(
    const CordzHandle* handle) const {
  if (!is_snapshot_) return false;
  if (handle == nullptr) return true;
  if (handle->is_snapshot_) return false;
  bool snapshot_found = false;
  Queue& global_queue = GlobalQueue();
  MutexLock lock(&global_queue.mutex);
  for (const CordzHandle* p = global_queue.dq_tail; p; p = p->dq_prev_) {
    if (p == handle) return !snapshot_found;
    if (p == this) snapshot_found = true;
  }
  ABSL_ASSERT(snapshot_found);  // Assert that 'this' is in delete queue.
  return true;
}